

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.c
# Opt level: O1

int main(int argc,char **argv)

{
  rnnvalue *prVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  rnndb *db;
  rnndeccontext *ctx;
  ulonglong addr;
  ulonglong value;
  rnnenum *prVar5;
  rnndomain *domain;
  rnndecaddrinfo *a;
  rnnbitset *prVar6;
  char **ppcVar7;
  char *pcVar8;
  long lVar9;
  int local_64;
  char *local_58;
  char *local_50;
  ulonglong local_48;
  
  local_48 = 0;
  rnn_init();
  if (argc < 2) {
LAB_001027c5:
    puts(
        "Usage:\n\tlookup [-f file.xml] [-a NVXX] -e enum-name [-- -v attribute value] value\n\tlookup [-f file.xml] [-a NVXX] -b bitset-name [-- -v attribute value] value\n\tlookup [-f file.xml] [-a NVXX] [-d domain-name] [-- -v attribute value] address\n\tlookup [-f file.xml] [-a NVXX] [-d domain-name] [-- -v attribute value] address value"
        );
    exit(2);
  }
  db = rnn_newdb();
  pcVar8 = "root.xml";
  local_50 = "NV_MMIO";
  local_64 = 100;
  bVar2 = false;
  local_58 = (char *)0x0;
LAB_00102456:
  while (iVar3 = getopt(argc,argv,"f:a:d:e:b:c"), iVar3 == 0x66) {
    pcVar8 = strdup(_optarg);
  }
  switch(iVar3) {
  case 0x61:
    local_48 = strtoull(_optarg,(char **)0x0,0x10);
    if ((int)local_48 == 0) {
      local_58 = strdup(_optarg);
      local_48 = 0;
    }
    else {
      free(local_58);
      local_58 = (char *)0x0;
    }
    goto LAB_00102456;
  case 0x62:
  case 100:
  case 0x65:
    local_50 = strdup(_optarg);
    local_64 = iVar3;
    goto LAB_00102456;
  case 99:
    bVar2 = true;
    goto LAB_00102456;
  }
  if (iVar3 != -1) goto LAB_001027c5;
  rnn_parsefile(db,pcVar8);
  rnn_prepdb(db);
  ctx = rnndec_newcontext(db);
  if (!bVar2) {
    ctx->colors = &envy_def_colors;
  }
  if (local_58 == (char *)0x0) {
    if ((int)local_48 != 0) {
      rnndec_varaddvalue(ctx,"chipset",(long)(int)local_48);
    }
  }
  else {
    rnndec_varadd(ctx,"chipset",local_58);
  }
  iVar3 = _optind;
  lVar9 = (long)_optind;
  pcVar8 = argv[lVar9];
  iVar4 = strcmp(pcVar8,"-v");
  if (iVar4 == 0) {
    ppcVar7 = argv + lVar9;
    do {
      rnndec_varadd(ctx,ppcVar7[1],ppcVar7[2]);
      iVar3 = _optind + 3;
      ppcVar7 = argv + (long)_optind + 3;
      pcVar8 = *ppcVar7;
      _optind = iVar3;
      iVar4 = strcmp(pcVar8,"-v");
    } while (iVar4 == 0);
  }
  if (argc <= iVar3) {
    main_cold_1();
    return 1;
  }
  value = 0;
  addr = strtoull(pcVar8,(char **)0x0,0x10);
  if (_optind + 1 < argc) {
    value = strtoull(argv[(long)_optind + 1],(char **)0x0,0x10);
  }
  iVar3 = 1;
  if (local_64 == 0x62) {
    prVar6 = rnn_findbitset(db,local_50);
    if (prVar6 != (rnnbitset *)0x0) {
      pcVar8 = "TODO";
LAB_00102727:
      puts(pcVar8);
LAB_0010272c:
      iVar3 = 0;
      goto LAB_0010272f;
    }
    pcVar8 = "Not a bitset: \'%s\'\n";
  }
  else if (local_64 == 100) {
    domain = rnn_finddomain(db,local_50);
    if (domain != (rnndomain *)0x0) {
      a = rnndec_decodeaddr(ctx,domain,addr,0);
      if (a == (rnndecaddrinfo *)0x0) goto LAB_0010272f;
      if (a->typeinfo != (rnntypeinfo *)0x0) {
        pcVar8 = rnndec_decodeval(ctx,a->typeinfo,value,a->width);
        iVar3 = 0;
        printf("%s => %s\n",a->name,pcVar8);
        free(pcVar8);
        rnndec_free_decaddrinfo(a);
        goto LAB_0010272f;
      }
      puts(a->name);
      rnndec_free_decaddrinfo(a);
      goto LAB_0010272c;
    }
    pcVar8 = "Not a domain: \'%s\'\n";
  }
  else {
    if (local_64 != 0x65) goto LAB_0010272f;
    prVar5 = rnn_findenum(db,local_50);
    if (prVar5 != (rnnenum *)0x0) {
      if (0 < (long)prVar5->valsnum) {
        lVar9 = 0;
        do {
          prVar1 = prVar5->vals[lVar9];
          if ((prVar1->valvalid != 0) && (prVar1->value == addr)) {
            pcVar8 = prVar1->name;
            goto LAB_00102727;
          }
          lVar9 = lVar9 + 1;
        } while (prVar5->valsnum != lVar9);
      }
      iVar3 = 0;
      printf("%#lx\n",addr);
      goto LAB_0010272f;
    }
    pcVar8 = "Not an enum: \'%s\'\n";
  }
  fprintf(_stderr,pcVar8,local_50);
LAB_0010272f:
  rnndec_freecontext(ctx);
  rnn_freedb(db);
  rnn_fini();
  return iVar3;
}

Assistant:

int main(int argc, char **argv) {
	char *file = "root.xml";
	char *name = "NV_MMIO";
	char *variant = NULL;
	int c, mode = 'd', chip = 0;
	uint64_t reg, colors=1, val = 0;
	struct rnndeccontext *vc;
	int ret;

	rnn_init();
	if (argc < 2) {
		usage();
	}
	struct rnndb *db = rnn_newdb();

	/* Arguments parsing */
	while ((c = getopt (argc, argv, "f:a:d:e:b:c")) != -1) {
		switch (c) {
			case 'f':
				file = strdup(optarg);
				break;
			case 'e':
				mode = 'e';
				name = strdup(optarg);
				break;
			case 'b':
				mode = 'b';
				name = strdup(optarg);
				break;
			case 'd':
				mode = 'd';
				name = strdup(optarg);
				break;
			case 'a':
				chip = strtoull(optarg, NULL, 16);
				if (!chip)
					variant = strdup(optarg);
				else {
					free(variant);
					variant = NULL;
				}
				break;
			case 'c':
				colors = 0;
				break;
			default: usage();
		}
	}

	rnn_parsefile (db, file);
	rnn_prepdb (db);
	vc = rnndec_newcontext(db);
	if(colors)
		vc->colors = &envy_def_colors;

	if (variant)
		rnndec_varadd(vc, "chipset", variant);
	else if (chip)
		rnndec_varaddvalue(vc, "chipset",  chip);

	/* Parse extra arguments */
	while (!strcmp (argv[optind], "-v")) {
		rnndec_varadd(vc, argv[optind+1], argv[optind+2]);
		optind+=3;
	}

	if (optind >= argc) {
		fprintf (stderr, "No address specified.\n");
		return 1;
	}

	reg = strtoull(argv[optind], 0, 16);
	if (optind + 1 < argc)
		val = strtoull(argv[optind + 1], 0, 16);

	if (mode == 'e') {
		struct rnnenum *en = rnn_findenum (db, name);
		if (en) {
			int i;
			int dec = 0;
			for (i = 0; i < en->valsnum; i++)
				if (en->vals[i]->valvalid && en->vals[i]->value == reg) {
					printf ("%s\n", en->vals[i]->name);
					dec = 1;
					break;
				}
			if (!dec)
				printf ("%#"PRIx64"\n", reg);

			ret = 0;
		} else {
			fprintf(stderr, "Not an enum: '%s'\n", name);
			ret = 1;
		}
	} else if (mode == 'b') {
		struct rnnbitset *bs = rnn_findbitset (db, name);

		if (bs) {
			printf("TODO\n");
			ret = 0;
		} else {
			fprintf(stderr, "Not a bitset: '%s'\n", name);
			ret = 1;
		}

	} else if (mode == 'd') {
		struct rnndomain *dom = rnn_finddomain (db, name);

		if (dom) {
			struct rnndecaddrinfo *info = rnndec_decodeaddr(vc, dom, reg, 0);
			if (info && info->typeinfo) {
				char *res = rnndec_decodeval(vc, info->typeinfo, val, info->width);
				printf ("%s => %s\n", info->name, res);
				free(res);
				rnndec_free_decaddrinfo(info);
				ret = 0;
			} else if (info) {
				printf ("%s\n", info->name);
				rnndec_free_decaddrinfo(info);
				ret = 0;
			} else
				ret = 1;
		} else {
			fprintf(stderr, "Not a domain: '%s'\n", name);
			ret = 1;
		}
	} else {
		ret = 1;
	}

	rnndec_freecontext(vc);
	rnn_freedb(db);
	rnn_fini();

	return ret;
}